

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O2

void __thiscall antlr::CharScanner::match(CharScanner *this,BitSet *b)

{
  bool bVar1;
  uint el;
  MismatchedCharException *this_00;
  BitSet BStack_48;
  
  el = (*(this->super_TokenStream)._vptr_TokenStream[3])(this,1);
  bVar1 = BitSet::member(b,el);
  if (bVar1) {
    (*(this->super_TokenStream)._vptr_TokenStream[8])(this);
    return;
  }
  this_00 = (MismatchedCharException *)__cxa_allocate_exception(0x90);
  std::vector<bool,_std::allocator<bool>_>::vector(&BStack_48.storage,&b->storage);
  MismatchedCharException::MismatchedCharException(this_00,el,&BStack_48,false,this);
  __cxa_throw(this_00,&MismatchedCharException::typeinfo,
              MismatchedCharException::~MismatchedCharException);
}

Assistant:

virtual void match(const BitSet& b)
	{
		int la_1 = LA(1);

		if ( !b.member(la_1) )
			throw MismatchedCharException( la_1, b, false, this );
		consume();
	}